

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Save(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar1 = Gia_ManHasMapping(pAbc->pGia);
      if (iVar1 == 0) {
        Abc_Print(-1,"GIA has no mapping.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar1 = Gia_ManCompareWithBest
                          (pAbc->pGiaBest,pAbc->pGia,&pAbc->nBestLuts,&pAbc->nBestEdges,
                           &pAbc->nBestLevels);
        if (iVar1 == 0) {
          pAbc_local._4_4_ = 0;
        }
        else {
          Gia_ManStopP(&pAbc->pGiaBest);
          pGVar2 = Gia_ManDupWithAttributes(pAbc->pGia);
          pAbc->pGiaBest = pGVar2;
          pAbc_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    Abc_Print(-2,"usage: &save [-h]\n");
    Abc_Print(-2,"\t        compares and possibly saves AIG with mapping\n");
    Abc_Print(-2,"\t-h    : print the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandAbc9Save( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "GIA has no mapping.\n" );
        return 1;
    }
    if ( !Gia_ManCompareWithBest( pAbc->pGiaBest, pAbc->pGia, &pAbc->nBestLuts, &pAbc->nBestEdges, &pAbc->nBestLevels ) )
        return 0;
    // save the design as best
    Gia_ManStopP( &pAbc->pGiaBest );
    pAbc->pGiaBest = Gia_ManDupWithAttributes( pAbc->pGia );
    return 0; 

usage:
    Abc_Print( -2, "usage: &save [-h]\n" );
    Abc_Print( -2, "\t        compares and possibly saves AIG with mapping\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}